

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Constant<float>::doEvaluate
          (Constant<float> *this,EvalContext *param_2)

{
  bool bVar1;
  IVal *in_RDI;
  double dVar2;
  double dVar3;
  
  bVar1 = NAN(this->m_value);
  dVar2 = (double)this->m_value;
  in_RDI->m_hasNaN = bVar1;
  dVar3 = dVar2;
  if (bVar1) {
    dVar3 = INFINITY;
  }
  in_RDI->m_lo = dVar3;
  if (bVar1) {
    dVar2 = -INFINITY;
  }
  in_RDI->m_hi = dVar2;
  return in_RDI;
}

Assistant:

IVal	doEvaluate		(const EvalContext&) const	{ return makeIVal(m_value); }